

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::instrLDY0xbc(CPU *this)

{
  uint8_t argument;
  CPU *in_RDI;
  
  argument = absolute_x_addr(in_RDI);
  LDY(in_RDI,argument);
  return 4;
}

Assistant:

int CPU::instrLDY0xbc() {
	LDY(absolute_x_addr());
	return 4;
}